

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O0

void __thiscall Rml::ElementStyle::UpdateDefinition(ElementStyle *this)

{
  Element *element;
  bool bVar1;
  PropertyId id_00;
  int iVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  PropertyIdSet *pPVar4;
  PropertyIdSet *other;
  Property *this_00;
  Property *other_00;
  element_type *old_definition;
  element_type *new_definition_00;
  PropertyIdSet PVar5;
  PropertyIdSetIterator PVar6;
  Property *p1;
  Property *p0;
  undefined1 auStack_90 [7];
  PropertyId id;
  PropertyIdSetIterator __end3;
  PropertyIdSetIterator __begin3;
  PropertyIdSet *__range3;
  PropertyIdSet properties_in_both_definitions;
  PropertyIdSet changed_properties;
  StyleSheet *style_sheet;
  SharedPtr<const_ElementDefinition> new_definition;
  ElementStyle *this_local;
  
  new_definition.super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  ::std::shared_ptr<const_Rml::ElementDefinition>::shared_ptr
            ((shared_ptr<const_Rml::ElementDefinition> *)&style_sheet);
  iVar2 = (*(this->element->super_ScriptInterface).super_Releasable._vptr_Releasable[4])();
  if ((Element *)CONCAT44(extraout_var,iVar2) != (Element *)0x0) {
    StyleSheet::GetElementDefinition
              ((StyleSheet *)(changed_properties.defined_ids.super__Base_bitset<2UL>._M_w + 1),
               (Element *)CONCAT44(extraout_var,iVar2));
    ::std::shared_ptr<const_Rml::ElementDefinition>::operator=
              ((shared_ptr<const_Rml::ElementDefinition> *)&style_sheet,
               (shared_ptr<const_Rml::ElementDefinition> *)
               (changed_properties.defined_ids.super__Base_bitset<2UL>._M_w + 1));
    ::std::shared_ptr<const_Rml::ElementDefinition>::~shared_ptr
              ((shared_ptr<const_Rml::ElementDefinition> *)
               (changed_properties.defined_ids.super__Base_bitset<2UL>._M_w + 1));
  }
  bVar1 = ::std::operator!=((shared_ptr<const_Rml::ElementDefinition> *)&style_sheet,
                            &this->definition);
  if (bVar1) {
    PropertyIdSet::PropertyIdSet
              ((PropertyIdSet *)
               (properties_in_both_definitions.defined_ids.super__Base_bitset<2UL>._M_w + 1));
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->definition);
    if (bVar1) {
      peVar3 = ::std::
               __shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->definition);
      pPVar4 = ElementDefinition::GetPropertyIds(peVar3);
      properties_in_both_definitions.defined_ids.super__Base_bitset<2UL>._M_w[1] =
           (pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[0];
      changed_properties.defined_ids.super__Base_bitset<2UL>._M_w[0] =
           (pPVar4->defined_ids).super__Base_bitset<2UL>._M_w[1];
    }
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&style_sheet);
    if (bVar1) {
      peVar3 = ::std::
               __shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&style_sheet);
      pPVar4 = ElementDefinition::GetPropertyIds(peVar3);
      PropertyIdSet::operator|=
                ((PropertyIdSet *)
                 (properties_in_both_definitions.defined_ids.super__Base_bitset<2UL>._M_w + 1),
                 pPVar4);
    }
    bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->definition);
    if ((bVar1) &&
       (bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&style_sheet), bVar1)) {
      peVar3 = ::std::
               __shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->definition);
      pPVar4 = ElementDefinition::GetPropertyIds(peVar3);
      peVar3 = ::std::
               __shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&style_sheet);
      other = ElementDefinition::GetPropertyIds(peVar3);
      PVar5 = PropertyIdSet::operator&(pPVar4,other);
      properties_in_both_definitions.defined_ids.super__Base_bitset<2UL>._M_w[0] =
           PVar5.defined_ids.super__Base_bitset<2UL>._M_w[1];
      __range3 = PVar5.defined_ids.super__Base_bitset<2UL>._M_w[0];
      PVar6 = PropertyIdSet::begin((PropertyIdSet *)&__range3);
      __end3.id_index = (size_t)PVar6.container;
      PVar6 = PropertyIdSet::end((PropertyIdSet *)&__range3);
      while( true ) {
        __end3.container = (PropertyIdSet *)PVar6.id_index;
        _auStack_90 = PVar6.container;
        bVar1 = PropertyIdSetIterator::operator!=
                          ((PropertyIdSetIterator *)&__end3.id_index,
                           (PropertyIdSetIterator *)auStack_90);
        if (!bVar1) break;
        id_00 = PropertyIdSetIterator::operator*((PropertyIdSetIterator *)&__end3.id_index);
        peVar3 = ::std::
                 __shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->definition);
        this_00 = ElementDefinition::GetProperty(peVar3,id_00);
        peVar3 = ::std::
                 __shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&style_sheet);
        other_00 = ElementDefinition::GetProperty(peVar3,id_00);
        if (((this_00 != (Property *)0x0) && (other_00 != (Property *)0x0)) &&
           (bVar1 = Property::operator==(this_00,other_00), bVar1)) {
          PropertyIdSet::Erase
                    ((PropertyIdSet *)
                     (properties_in_both_definitions.defined_ids.super__Base_bitset<2UL>._M_w + 1),
                     id_00);
        }
        PropertyIdSetIterator::operator++((PropertyIdSetIterator *)&__end3.id_index);
        PVar6.id_index = (size_t)__end3.container;
        PVar6.container = _auStack_90;
      }
      element = this->element;
      old_definition =
           ::std::__shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->definition).
                       super___shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>)
      ;
      new_definition_00 =
           ::std::__shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<const_Rml::ElementDefinition,_(__gnu_cxx::_Lock_policy)2> *)
                      &style_sheet);
      TransitionPropertyChanges
                (element,(PropertyIdSet *)
                         (properties_in_both_definitions.defined_ids.super__Base_bitset<2UL>._M_w +
                         1),&this->inline_properties,old_definition,new_definition_00);
    }
    ::std::shared_ptr<const_Rml::ElementDefinition>::operator=
              (&this->definition,(shared_ptr<const_Rml::ElementDefinition> *)&style_sheet);
    DirtyProperties(this,(PropertyIdSet *)
                         (properties_in_both_definitions.defined_ids.super__Base_bitset<2UL>._M_w +
                         1));
  }
  ::std::shared_ptr<const_Rml::ElementDefinition>::~shared_ptr
            ((shared_ptr<const_Rml::ElementDefinition> *)&style_sheet);
  return;
}

Assistant:

void ElementStyle::UpdateDefinition()
{
	RMLUI_ZoneScoped;

	SharedPtr<const ElementDefinition> new_definition;

	if (const StyleSheet* style_sheet = element->GetStyleSheet())
	{
		new_definition = style_sheet->GetElementDefinition(element);
	}

	// Switch the property definitions if the definition has changed.
	if (new_definition != definition)
	{
		PropertyIdSet changed_properties;

		if (definition)
			changed_properties = definition->GetPropertyIds();

		if (new_definition)
			changed_properties |= new_definition->GetPropertyIds();

		if (definition && new_definition)
		{
			// Remove properties that compare equal from the changed list.
			const PropertyIdSet properties_in_both_definitions = (definition->GetPropertyIds() & new_definition->GetPropertyIds());

			for (PropertyId id : properties_in_both_definitions)
			{
				const Property* p0 = definition->GetProperty(id);
				const Property* p1 = new_definition->GetProperty(id);
				if (p0 && p1 && *p0 == *p1)
					changed_properties.Erase(id);
			}

			// Transition changed properties if transition property is set
			TransitionPropertyChanges(element, changed_properties, inline_properties, definition.get(), new_definition.get());
		}

		definition = new_definition;

		DirtyProperties(changed_properties);
	}
}